

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.h
# Opt level: O1

void __thiscall
slang::ast::CallExpression::visitExprs<slang::ast::ConstraintExprVisitor&>
          (CallExpression *this,ConstraintExprVisitor *visitor)

{
  __index_type _Var1;
  Expression *pEVar2;
  size_type sVar3;
  pointer ppEVar4;
  variant_alternative_t<1UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *pvVar5;
  variant_alternative_t<1UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar6;
  variant_alternative_t<2UL,_variant<monostate,_IteratorCallInfo,_RandomizeCallInfo>_> *pvVar7;
  long lVar8;
  
  pEVar2 = this->thisClass_;
  if (pEVar2 != (Expression *)0x0) {
    Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
              (pEVar2,pEVar2,visitor);
  }
  if (*(__index_type *)
       ((long)&(this->subroutine).
               super__Variant_base<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_assign_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Move_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Copy_ctor_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
               .
               super__Variant_storage_alias<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
       + 0x30) == '\x01') {
    pvVar5 = std::
             get<1ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                       (&this->subroutine);
    _Var1 = *(__index_type *)
             ((long)&(pvVar5->extraInfo).
                     super__Variant_base<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Move_assign_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
                     .
                     super__Variant_storage_alias<std::monostate,_slang::ast::CallExpression::IteratorCallInfo,_slang::ast::CallExpression::RandomizeCallInfo>
             + 0x18);
    if (_Var1 == '\x02') {
      pvVar7 = std::
               get<2ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                         (&pvVar5->extraInfo);
      if (pvVar7->inlineConstraints != (Constraint *)0x0) {
        Constraint::visit<slang::ast::ConstraintExprVisitor>(pvVar7->inlineConstraints,visitor);
      }
    }
    else if (_Var1 == '\x01') {
      pvVar6 = std::
               get<1ul,std::monostate,slang::ast::CallExpression::IteratorCallInfo,slang::ast::CallExpression::RandomizeCallInfo>
                         (&pvVar5->extraInfo);
      pEVar2 = pvVar6->iterExpr;
      if (pEVar2 != (Expression *)0x0) {
        Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
                  (pEVar2,pEVar2,visitor);
      }
    }
  }
  sVar3 = (this->arguments_).size_;
  if (sVar3 != 0) {
    ppEVar4 = (this->arguments_).data_;
    lVar8 = 0;
    do {
      pEVar2 = *(Expression **)((long)ppEVar4 + lVar8);
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
                (pEVar2,pEVar2,visitor);
      lVar8 = lVar8 + 8;
    } while (sVar3 << 3 != lVar8);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (thisClass())
            thisClass()->visit(visitor);

        if (isSystemCall()) {
            auto& extra = std::get<1>(subroutine).extraInfo;
            if (extra.index() == 1) {
                if (auto iterExpr = std::get<1>(extra).iterExpr)
                    iterExpr->visit(visitor);
            }
            else if (extra.index() == 2) {
                if (auto constraints = std::get<2>(extra).inlineConstraints)
                    constraints->visit(visitor);
            }
        }

        for (auto arg : arguments())
            arg->visit(visitor);
    }